

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O3

void __thiscall
merkle_tests::merkle_test_LeftSubtreeRightSubtree::test_method
          (merkle_test_LeftSubtreeRightSubtree *this)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<uint256,_std::allocator<uint256>_> hashes;
  undefined1 auVar2 [16];
  undefined1 auVar3 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ulong uVar5;
  ulong uVar6;
  iterator in_R8;
  iterator in_R9;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  const_string file;
  const_string msg;
  undefined8 in_stack_fffffffffffffce8;
  _func_int **in_stack_fffffffffffffcf0;
  bool in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffcf9;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  vector<uint256,_std::allocator<uint256>_> local_2d0;
  vector<uint256,_std::allocator<uint256>_> leftRight;
  CMutableTransaction mtx;
  uint256 *local_260;
  undefined1 local_258 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  undefined1 *local_248;
  uint256 **local_240;
  undefined1 local_238 [8];
  char *local_230 [2];
  assertion_result local_220;
  uint256 rootOfLR;
  uint256 rootOfRightSubtree;
  uint256 rootOfLeftSubtree;
  uint256 root;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [11];
  undefined5 uStack_12d;
  undefined1 auStack_128 [11];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [11];
  undefined5 uStack_bd;
  undefined1 auStack_b8 [11];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_11_ = SUB1611((undefined1  [16])0x0,5);
  local_58._0_8_ = (pointer)0x0;
  local_58._8_3_ = 0;
  local_58._11_5_ = 0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  auStack_b8 = SUB1611((undefined1  [16])0x0,5);
  local_c8 = SUB1611((undefined1  [16])0x0,0);
  uStack_bd = 0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  auStack_128 = SUB1611((undefined1  [16])0x0,5);
  local_138 = SUB1611((undefined1  [16])0x0,0);
  uStack_12d = 0;
  local_148 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_58,4);
  if ((pointer)CONCAT53(local_58._11_5_,local_58._8_3_) == (pointer)local_58._0_8_) {
    uVar5 = 0;
  }
  else {
    lVar8 = 8;
    uVar7 = 0;
    do {
      CMutableTransaction::CMutableTransaction(&mtx);
      mtx.nLockTime = (uint32_t)uVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = _Stack_250._M_pi;
      _local_258 = auVar2 << 0x40;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 8),
                 (CTransaction **)local_258,(allocator<CTransaction> *)&root,&mtx);
      auVar3 = local_258;
      _Var4._M_pi = _Stack_250._M_pi;
      _local_258 = (undefined1  [16])0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         local_58._0_8_)->_M_ptr + lVar8);
      puVar1 = (undefined8 *)(local_58._0_8_ + lVar8 + -8);
      *puVar1 = auVar3;
      puVar1[1] = _Var4._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (_Stack_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_250._M_pi);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx.vin);
      uVar7 = uVar7 + 1;
      uVar5 = CONCAT53(local_58._11_5_,local_58._8_3_) - local_58._0_8_ >> 4;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < uVar5);
  }
  if (uVar5 < 2) {
    uVar6 = uVar5 >> 1;
  }
  else {
    lVar8 = 0;
    uVar7 = 0;
    do {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)local_c8,
                  (value_type *)
                  ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                          local_58._0_8_)->_M_ptr + lVar8));
      uVar7 = uVar7 + 1;
      uVar5 = CONCAT53(local_58._11_5_,local_58._8_3_) - local_58._0_8_ >> 4;
      uVar6 = uVar5 >> 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < uVar6);
  }
  if (uVar6 < uVar5) {
    lVar8 = uVar6 << 4;
    do {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)local_138,
                  (value_type *)
                  ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                          local_58._0_8_)->_M_ptr + lVar8));
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar6 < (ulong)(CONCAT53(local_58._11_5_,local_58._8_3_) - local_58._0_8_ >> 4));
  }
  BlockMerkleRoot(&root,(CBlock *)local_a8,(bool *)0x0);
  BlockMerkleRoot(&rootOfLeftSubtree,(CBlock *)local_118,(bool *)0x0);
  BlockMerkleRoot(&rootOfRightSubtree,(CBlock *)local_188,(bool *)0x0);
  leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
            ((vector<uint256,std::allocator<uint256>> *)&leftRight,(iterator)0x0,&rootOfLeftSubtree)
  ;
  if (leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
              ((vector<uint256,std::allocator<uint256>> *)&leftRight,
               (iterator)
               leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish,&rootOfRightSubtree);
  }
  else {
    *(undefined8 *)
     (((leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
         rootOfRightSubtree.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     (((leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
         rootOfRightSubtree.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     ((leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems =
         rootOfRightSubtree.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     (((leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) =
         rootOfRightSubtree.super_base_blob<256U>.m_data._M_elems._8_8_;
    leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector(&local_2d0,&leftRight);
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffcf0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffce8;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = in_stack_fffffffffffffcf8;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = in_stack_fffffffffffffcf9;
  ComputeMerkleRoot(&rootOfLR,hashes,(bool *)&local_2d0);
  if (local_2d0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x147;
  file.m_begin = (iterator)&local_2e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2f0,msg);
  auVar10[0] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0] ==
                root.super_base_blob<256U>.m_data._M_elems[0]);
  auVar10[1] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[1] ==
                root.super_base_blob<256U>.m_data._M_elems[1]);
  auVar10[2] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[2] ==
                root.super_base_blob<256U>.m_data._M_elems[2]);
  auVar10[3] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[3] ==
                root.super_base_blob<256U>.m_data._M_elems[3]);
  auVar10[4] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[4] ==
                root.super_base_blob<256U>.m_data._M_elems[4]);
  auVar10[5] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[5] ==
                root.super_base_blob<256U>.m_data._M_elems[5]);
  auVar10[6] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[6] ==
                root.super_base_blob<256U>.m_data._M_elems[6]);
  auVar10[7] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[7] ==
                root.super_base_blob<256U>.m_data._M_elems[7]);
  auVar10[8] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[8] ==
                root.super_base_blob<256U>.m_data._M_elems[8]);
  auVar10[9] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[9] ==
                root.super_base_blob<256U>.m_data._M_elems[9]);
  auVar10[10] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[10] ==
                 root.super_base_blob<256U>.m_data._M_elems[10]);
  auVar10[0xb] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  root.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar10[0xc] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  root.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar10[0xd] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  root.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar10[0xe] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  root.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar10[0xf] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  root.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar9[0] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x10] ==
               root.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar9[1] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x11] ==
               root.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar9[2] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x12] ==
               root.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar9[3] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x13] ==
               root.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar9[4] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x14] ==
               root.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar9[5] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x15] ==
               root.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar9[6] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x16] ==
               root.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar9[7] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x17] ==
               root.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar9[8] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x18] ==
               root.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar9[9] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x19] ==
               root.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar9[10] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                root.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar9[0xb] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 root.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar9[0xc] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 root.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar9[0xd] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 root.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar9[0xe] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 root.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar9[0xf] = -(rootOfLR.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 root.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar9 = auVar9 & auVar10;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
  ;
  local_230[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/merkle_tests.cpp"
                         + 0x65);
  mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_238;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01389a00;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_240 = &local_260;
  _Stack_250._M_pi._0_1_ = 0;
  local_258 = (undefined1  [8])&PTR__lazy_ostream_01389a00;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_260 = &rootOfLR;
  local_238 = (undefined1  [8])&root;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)&stack0xfffffffffffffcf0,1,2,REQUIRE,0xf9bac1,
             (size_t)local_230,0x147,&mtx,"rootOfLR",local_258);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  if (leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)leftRight.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_c8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_LeftSubtreeRightSubtree)
{
    CBlock block, leftSubtreeBlock, rightSubtreeBlock;

    block.vtx.resize(4);
    std::size_t pos;
    for (pos = 0; pos < block.vtx.size(); pos++) {
        CMutableTransaction mtx;
        mtx.nLockTime = pos;
        block.vtx[pos] = MakeTransactionRef(std::move(mtx));
    }

    for (pos = 0; pos < block.vtx.size() / 2; pos++)
        leftSubtreeBlock.vtx.push_back(block.vtx[pos]);

    for (pos = block.vtx.size() / 2; pos < block.vtx.size(); pos++)
        rightSubtreeBlock.vtx.push_back(block.vtx[pos]);

    uint256 root = BlockMerkleRoot(block);
    uint256 rootOfLeftSubtree = BlockMerkleRoot(leftSubtreeBlock);
    uint256 rootOfRightSubtree = BlockMerkleRoot(rightSubtreeBlock);
    std::vector<uint256> leftRight;
    leftRight.push_back(rootOfLeftSubtree);
    leftRight.push_back(rootOfRightSubtree);
    uint256 rootOfLR = ComputeMerkleRoot(leftRight);

    BOOST_CHECK_EQUAL(root, rootOfLR);
}